

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

ProStringList * __thiscall
MakefileGenerator::createObjectList(MakefileGenerator *this,ProStringList *sources)

{
  QStringView v;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  const_iterator o;
  qsizetype qVar4;
  char *pcVar5;
  __mode_t __mode;
  MakefileGenerator *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int lastDirSepPosition;
  ProStringList *ret;
  QString outRelativePath;
  QString sourceRelativePath;
  QString dir;
  QFileInfo fi;
  QString sfn;
  ConstIterator it;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_0000025c;
  QString objdir;
  undefined4 in_stack_fffffffffffffcf8;
  FileFixifyType in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  CaseSensitivity in_stack_fffffffffffffd04;
  QMakeProject *this_00;
  undefined6 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd16;
  byte in_stack_fffffffffffffd17;
  QMakeProject *in_stack_fffffffffffffd18;
  QMakeProject *ch;
  undefined1 in_stack_fffffffffffffda7;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  MakefileGenerator *in_stack_fffffffffffffdb0;
  char local_1c8 [72];
  QStringBuilder<const_char_(&)[3],_QString_&> local_180;
  undefined1 local_170 [32];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  QString local_120 [2];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  const_iterator local_d0 [22];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&(in_RDI->d).d)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  ProStringList::ProStringList((ProStringList *)0x1812b5);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x1812ef);
  ch = in_RSI->project;
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  QMakeProject::values
            ((QMakeProject *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (ProKey *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x18132e);
  ProKey::~ProKey((ProKey *)0x181341);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffd18 = in_RSI->project;
    ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QMakeEvaluator::first
              (&in_stack_fffffffffffffd18->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_fffffffffffffd17,
                        CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
    ;
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QString::~QString((QString *)0x1813c4);
    ProString::~ProString((ProString *)0x1813d1);
    ProKey::~ProKey((ProKey *)0x1813de);
  }
  local_d0[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_d0[0] = QList<ProString>::begin
                          ((QList<ProString> *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  while( true ) {
    o = QList<ProString>::end
                  ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
                  );
    bVar1 = QList<ProString>::const_iterator::operator!=(local_d0,o);
    if (!bVar1) break;
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::const_iterator::operator*(local_d0);
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
    ;
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    Option::normalizePath
              ((QString *)in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17,
               (bool)in_stack_fffffffffffffd16);
    fileInfo(in_RSI,in_RDI);
    QString::~QString((QString *)0x1814c5);
    local_120[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_120[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_120[0].d.size = -0x5555555555555556;
    QString::QString((QString *)0x1814ff);
    this_00 = in_RSI->project;
    QString::QString((QString *)this_00,(char *)ch);
    in_stack_fffffffffffffd17 =
         QMakeProject::isActiveConfig
                   (this_00,(QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
                    ,SUB41(in_stack_fffffffffffffcfc >> 0x18,0));
    QString::~QString((QString *)0x181549);
    if ((in_stack_fffffffffffffd17 & 1) == 0) {
      QString::operator=(local_120,(QString *)&local_20);
    }
    else {
      local_150 = 0xaaaaaaaaaaaaaaaa;
      local_148 = 0xaaaaaaaaaaaaaaaa;
      local_140 = 0xaaaaaaaaaaaaaaaa;
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcfc);
      fileFixify(in_stack_fffffffffffffdb0,
                 (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 (FileFixifyTypes)in_stack_0000025c.i,(bool)in_stack_fffffffffffffda7);
      local_180 = ::operator+((char (*) [3])
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_char_(&)[3],_QString_&> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      uVar2 = QString::startsWith((QString *)&local_150,(CaseSensitivity)local_170);
      in_stack_fffffffffffffd04 = CONCAT13(uVar2,(int3)in_stack_fffffffffffffd04);
      QString::~QString((QString *)0x18161f);
      if ((in_stack_fffffffffffffd04 & 0x1000000) != CaseInsensitive) {
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcfc);
        fileFixify(in_stack_fffffffffffffdb0,
                   (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   (FileFixifyTypes)in_stack_0000025c.i,(bool)in_stack_fffffffffffffda7);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
        ;
        QString::~QString((QString *)0x181684);
      }
      bVar1 = QDir::isAbsolutePath((QString *)0x181691);
      if (bVar1) {
        QString::indexOf((QString *)&local_150,0x3bdbd8,CaseInsensitive);
        QString::remove((longlong)&local_150,0);
      }
      QString::operator=(local_120,(QString *)&local_20);
      qVar4 = QString::lastIndexOf
                        ((QString *)
                         CONCAT17(in_stack_fffffffffffffd17,
                                  CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)),
                         (QString *)this_00,in_stack_fffffffffffffd04);
      if ((int)qVar4 != -1) {
        QStringView::QStringView<QString,_true>
                  ((QStringView *)
                   CONCAT17(in_stack_fffffffffffffd17,
                            CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)),
                   (QString *)this_00);
        QStringView::left((QStringView *)in_stack_fffffffffffffd18,
                          CONCAT17(in_stack_fffffffffffffd17,
                                   CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
        v.m_size._6_1_ = in_stack_fffffffffffffd16;
        v.m_size._0_6_ = in_stack_fffffffffffffd10;
        v.m_size._7_1_ = in_stack_fffffffffffffd17;
        v.m_data = (storage_type_conflict *)in_stack_fffffffffffffd18;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                            ,v);
      }
      bVar1 = noIO(in_RSI);
      if (!bVar1) {
        local_1c8[0] = -0x56;
        local_1c8[1] = -0x56;
        local_1c8[2] = -0x56;
        local_1c8[3] = -0x56;
        local_1c8[4] = -0x56;
        local_1c8[5] = -0x56;
        local_1c8[6] = -0x56;
        local_1c8[7] = -0x56;
        local_1c8[8] = -0x56;
        local_1c8[9] = -0x56;
        local_1c8[10] = -0x56;
        local_1c8[0xb] = -0x56;
        local_1c8[0xc] = -0x56;
        local_1c8[0xd] = -0x56;
        local_1c8[0xe] = -0x56;
        local_1c8[0xf] = -0x56;
        local_1c8[0x10] = -0x56;
        local_1c8[0x11] = -0x56;
        local_1c8[0x12] = -0x56;
        local_1c8[0x13] = -0x56;
        local_1c8[0x14] = -0x56;
        local_1c8[0x15] = -0x56;
        local_1c8[0x16] = -0x56;
        local_1c8[0x17] = -0x56;
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcfc);
        fileFixify(in_stack_fffffffffffffdb0,
                   (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   (FileFixifyTypes)in_stack_0000025c.i,(bool)in_stack_fffffffffffffda7);
        bVar1 = QString::isEmpty((QString *)0x1817d7);
        if ((!bVar1) && (uVar3 = mkdir(in_RSI,local_1c8,__mode), (uVar3 & 1) == 0)) {
          QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                           );
          pcVar5 = QByteArray::constData((QByteArray *)0x181813);
          warn_msg(WarnLogic,"Cannot create directory \'%s\'",pcVar5);
          QByteArray::~QByteArray((QByteArray *)0x181836);
        }
        QString::~QString((QString *)0x181843);
      }
      QString::~QString((QString *)0x181850);
    }
    QFileInfo::completeBaseName();
    ::operator+((QString *)this_00,
                (QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    ::operator+((QStringBuilder<QString_&,_QString> *)this_00,
                (QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    ProString::ProString<QStringBuilder<QString&,QString>,QString&>
              ((ProString *)
               CONCAT17(in_stack_fffffffffffffd17,
                        CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)),
               (QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)this_00);
    QList<ProString>::append
              ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    ProString::~ProString((ProString *)0x1818e9);
    QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)0x1818f6);
    QStringBuilder<QString_&,_QString>::~QStringBuilder
              ((QStringBuilder<QString_&,_QString> *)0x181903);
    QString::~QString((QString *)0x181910);
    QString::~QString((QString *)0x18191d);
    QFileInfo::~QFileInfo((QFileInfo *)&local_f0);
    QString::~QString((QString *)0x181937);
    QList<ProString>::const_iterator::operator++(local_d0);
  }
  QString::~QString((QString *)0x18195b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ProStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
MakefileGenerator::createObjectList(const ProStringList &sources)
{
    ProStringList ret;
    QString objdir;
    if(!project->values("OBJECTS_DIR").isEmpty())
        objdir = project->first("OBJECTS_DIR").toQString();
    for (ProStringList::ConstIterator it = sources.begin(); it != sources.end(); ++it) {
        QString sfn = (*it).toQString();
        QFileInfo fi(fileInfo(Option::normalizePath(sfn)));
        QString dir;
        if (project->isActiveConfig("object_parallel_to_source")) {
            // The source paths are relative to the output dir, but we need source-relative paths
            QString sourceRelativePath = fileFixify(sfn, FileFixifyBackwards);

            if (sourceRelativePath.startsWith(".." + Option::dir_sep))
                sourceRelativePath = fileFixify(sourceRelativePath, FileFixifyAbsolute);

            if (QDir::isAbsolutePath(sourceRelativePath))
                sourceRelativePath.remove(0, sourceRelativePath.indexOf(Option::dir_sep) + 1);

            dir = objdir; // We still respect OBJECTS_DIR

            int lastDirSepPosition = sourceRelativePath.lastIndexOf(Option::dir_sep);
            if (lastDirSepPosition != -1)
                dir += QStringView{sourceRelativePath}.left(lastDirSepPosition + 1);

            if (!noIO()) {
                // Ensure that the final output directory of each object exists
                QString outRelativePath = fileFixify(dir, FileFixifyBackwards);
                if (!outRelativePath.isEmpty() && !mkdir(outRelativePath))
                    warn_msg(WarnLogic, "Cannot create directory '%s'", outRelativePath.toLatin1().constData());
            }
        } else {
            dir = objdir;
        }
        ret.append(dir + fi.completeBaseName() + Option::obj_ext);
    }
    return ret;
}